

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::setArrayFromVector
          (QPDFObjectHandle *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *items
          )

{
  Array array;
  allocator<char> local_51;
  Array local_50;
  string local_38;
  
  as_array(&local_50,this,strict);
  if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"ignoring attempt to replace items",&local_51);
    typeWarning(this,"array",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    ::qpdf::Array::setFromVector(&local_50,items);
  }
  ::qpdf::Array::~Array(&local_50);
  return;
}

Assistant:

void
QPDFObjectHandle::setArrayFromVector(std::vector<QPDFObjectHandle> const& items)
{
    if (auto array = as_array(strict)) {
        array.setFromVector(items);
    } else {
        typeWarning("array", "ignoring attempt to replace items");
        QTC::TC("qpdf", "QPDFObjectHandle array ignoring replace items");
    }
}